

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::DeleteProperty
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,PropertyOperationFlags flags)

{
  BOOL BVar1;
  ES5Array *arr;
  uint32 local_2c [2];
  uint32 index;
  
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_2c);
  if (BVar1 == 0) {
    BVar1 = DictionaryTypeHandlerBase<unsigned_short>::DeleteProperty
                      (&this->super_DictionaryTypeHandlerBase<unsigned_short>,instance,propertyId,
                       flags);
  }
  else {
    arr = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
    BVar1 = DeleteItem(this,arr,instance,local_2c[0],flags);
  }
  return BVar1;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::DeleteProperty(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags flags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return DeleteItem(VarTo<ES5Array>(instance), instance, index, flags);
        }

        return __super::DeleteProperty(instance, propertyId, flags);
    }